

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.cpp
# Opt level: O2

bool __thiscall CGameControllerCTF::DoWincheckMatch(CGameControllerCTF *this)

{
  IServer *pIVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = (this->super_IGameController).m_GameInfo.m_ScoreLimit;
  if (((0 < iVar2) &&
      ((iVar2 <= (this->super_IGameController).m_aTeamscore[0] ||
       (iVar2 <= (this->super_IGameController).m_aTeamscore[1])))) ||
     ((iVar2 = (this->super_IGameController).m_GameInfo.m_TimeLimit, 0 < iVar2 &&
      (pIVar1 = (this->super_IGameController).m_pServer,
      iVar3 = pIVar1->m_CurrentGameTick - (this->super_IGameController).m_GameStartTick,
      iVar2 = iVar2 * pIVar1->m_TickSpeed, SBORROW4(iVar3,iVar2 * 0x3c) == iVar3 + iVar2 * -0x3c < 0
      )))) {
    iVar2 = (this->super_IGameController).m_aTeamscore[0];
    if ((this->super_IGameController).m_SuddenDeath == 0) {
      if (iVar2 != (this->super_IGameController).m_aTeamscore[1]) goto LAB_0011b7a9;
      (this->super_IGameController).m_SuddenDeath = 1;
    }
    else if (iVar2 / 100 != (this->super_IGameController).m_aTeamscore[1] / 100) {
LAB_0011b7a9:
      IGameController::EndMatch(&this->super_IGameController);
      return true;
    }
  }
  return false;
}

Assistant:

bool CGameControllerCTF::DoWincheckMatch()
{
	// check score win condition
	if((m_GameInfo.m_ScoreLimit > 0 && (m_aTeamscore[TEAM_RED] >= m_GameInfo.m_ScoreLimit || m_aTeamscore[TEAM_BLUE] >= m_GameInfo.m_ScoreLimit)) ||
		(m_GameInfo.m_TimeLimit > 0 && (Server()->Tick()-m_GameStartTick) >= m_GameInfo.m_TimeLimit*Server()->TickSpeed()*60))
	{
		if(m_SuddenDeath)
		{
			if(m_aTeamscore[TEAM_RED]/100 != m_aTeamscore[TEAM_BLUE]/100)
			{
				EndMatch();
				return true;
			}
		}
		else
		{
			if(m_aTeamscore[TEAM_RED] != m_aTeamscore[TEAM_BLUE])
			{
				EndMatch();
				return true;
			}
			else
				m_SuddenDeath = 1;
		}
	}
	return false;
}